

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DArrayFilteringTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DArrayFilteringTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *poVar1;
  float fVar2;
  undefined8 uVar3;
  FilterMode FVar4;
  FilterMode FVar5;
  TextureFormat TVar6;
  TestContext *pTVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  TestTexture2DArray *pTVar10;
  bool bVar11;
  int iVar12;
  deUint32 dVar13;
  deUint32 dVar14;
  undefined4 extraout_EAX;
  int iVar15;
  undefined4 extraout_var;
  long lVar16;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte bVar17;
  uint uVar18;
  pointer pFVar19;
  void *data;
  float fVar20;
  undefined1 auVar21 [16];
  Surface rendered;
  Texture2DArrayView local_388;
  LodPrecision local_374;
  LookupPrecision local_368;
  float local_338;
  TestTexture2DArray *local_328;
  TextureFormat texFmt;
  PixelFormat pixelFormat;
  float local_308;
  float fStack_304;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  IVec4 formatBitDepth;
  undefined1 local_2a8 [120];
  ios_base local_230 [276];
  undefined1 local_11c [76];
  long lStack_d0;
  long local_c8;
  int aiStack_c0 [2];
  int local_b8;
  anon_union_16_3_1194ccdc_for_v local_b4;
  undefined8 local_a4;
  LodMode local_9c;
  IVec4 colorBits;
  TextureFormatInfo fmtInfo;
  
  pFVar19 = (this->m_cases).
            super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  TVar6 = (TextureFormat)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  iVar15 = this->m_caseNdx;
  this_00 = &this->m_renderer;
  local_328 = util::TextureRenderer::get2DArrayTexture(this_00,pFVar19[iVar15].textureIndex);
  iVar12 = (*(local_328->super_TestTexture)._vptr_TestTexture[0xe])();
  texFmt = *(TextureFormat *)CONCAT44(extraout_var,iVar12);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_11c,TEXTURETYPE_2D_ARRAY);
  dVar13 = util::TextureRenderer::getRenderWidth(this_00);
  dVar14 = util::TextureRenderer::getRenderHeight(this_00);
  tcu::Surface::Surface(&rendered,dVar13,dVar14);
  local_2c8 = 0.0;
  fStack_2c4 = 0.0;
  fStack_2c0 = 0.0;
  fStack_2bc = 0.0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  util::createSampler((Sampler *)local_2a8,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  local_b8 = local_2a8._32_4_;
  local_c8 = local_2a8._16_8_;
  aiStack_c0[0] = local_2a8._24_4_;
  aiStack_c0[1] = local_2a8._28_4_;
  local_11c._68_8_ = local_2a8._0_8_;
  lStack_d0 = local_2a8._8_8_;
  local_b4._0_8_ = local_2a8._36_8_;
  local_b4._8_8_ = local_2a8._44_8_;
  local_a4 = local_2a8._52_8_;
  local_11c._4_4_ = glu::TextureTestUtil::getSamplerType(texFmt);
  local_9c = LODMODE_EXACT;
  local_11c._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_11c._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_11c._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_11c._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_11c._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_11c._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_11c._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_11c._48_4_ = fmtInfo.lookupScale.m_data[3];
  poVar1 = (ostringstream *)(local_2a8 + 8);
  local_2a8._0_8_ = TVar6;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Approximate lod per axis = ",0x1b);
  pFVar19 = pFVar19 + iVar15;
  tcu::operator<<((ostream *)poVar1,&pFVar19->lod);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", offset = ",0xb);
  tcu::operator<<((ostream *)poVar1,&pFVar19->offset);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_230);
  local_338 = (pFVar19->lod).m_data[1];
  uVar3 = *(undefined8 *)(pFVar19->offset).m_data;
  fVar20 = expf((pFVar19->lod).m_data[0] * 0.6931472);
  dVar13 = util::TextureRenderer::getRenderWidth(this_00);
  lVar16 = (**(code **)((long)(((this->m_textures).
                                super__Vector_base<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr->super_TestTexture
                              )._vptr_TestTexture + 0x88))();
  iVar15 = *(int *)(lVar16 + 0x38);
  local_338 = expf(local_338 * 0.6931472);
  dVar14 = util::TextureRenderer::getRenderHeight(this_00);
  lVar16 = (**(code **)((long)(((this->m_textures).
                                super__Vector_base<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr->super_TestTexture
                              )._vptr_TestTexture + 0x88))();
  fVar2 = (pFVar19->layerRange).m_data[0];
  fStack_2bc = (pFVar19->layerRange).m_data[1];
  local_308 = (float)uVar3;
  fStack_304 = (float)((ulong)uVar3 >> 0x20);
  local_2c8 = fVar2 * 0.5 + fStack_2bc * 0.5;
  uStack_2e0 = CONCAT44(local_308,fVar2);
  fStack_2c4 = (fVar20 * (float)dVar13) / (float)iVar15 + local_308;
  fStack_2c0 = (local_338 * (float)dVar14) / (float)*(int *)(lVar16 + 0x3c) + fStack_304;
  local_2d8 = CONCAT44(local_2c8,fStack_2c0);
  uStack_2d0 = CONCAT44(fStack_304,fStack_2c4);
  local_2e8 = uVar3;
  util::TextureRenderer::renderQuad
            (this_00,&rendered,pFVar19->textureIndex,(float *)&local_2e8,
             (ReferenceParams *)local_11c);
  FVar4 = (this->m_testParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.magFilter;
  FVar5 = (this->m_testParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.minFilter;
  local_2a8._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_2a8);
  uVar18 = (FVar4 == NEAREST && FVar5 == NEAREST) | 0xfffffffe;
  pixelFormat.redBits = formatBitDepth.m_data[0];
  pixelFormat.greenBits = formatBitDepth.m_data[1];
  pixelFormat.blueBits = formatBitDepth.m_data[2];
  pixelFormat.alphaBits = formatBitDepth.m_data[3];
  colorBits.m_data[0] =
       -(uint)(0 < (int)(uVar18 + formatBitDepth.m_data[0])) & uVar18 + formatBitDepth.m_data[0];
  colorBits.m_data[1] =
       -(uint)(0 < (int)(uVar18 + formatBitDepth.m_data[1])) & uVar18 + formatBitDepth.m_data[1];
  colorBits.m_data[2] =
       -(uint)(0 < (int)(uVar18 + formatBitDepth.m_data[2])) & uVar18 + formatBitDepth.m_data[2];
  colorBits.m_data[3] =
       -(uint)(0 < (int)(uVar18 + formatBitDepth.m_data[3])) & uVar18 + formatBitDepth.m_data[3];
  local_374.rule = RULE_VULKAN;
  local_374.derivateBits = 0x12;
  local_368.coordBits.m_data[0] = 0x16;
  local_368.coordBits.m_data[1] = 0x16;
  local_368.coordBits.m_data[2] = 0x16;
  local_368.uvwBits.m_data[0] = 0x10;
  local_368.uvwBits.m_data[1] = 0x10;
  local_368.uvwBits.m_data[2] = 0x10;
  local_368.colorThreshold.m_data = (float  [4])ZEXT816(0);
  local_368.colorMask.m_data[0] = true;
  local_368.colorMask.m_data[1] = true;
  local_368.colorMask.m_data[2] = true;
  local_368.colorMask.m_data[3] = true;
  local_374.lodBits = 6;
  tcu::computeFixedPointThreshold((tcu *)local_2a8,&colorBits);
  pTVar10 = local_328;
  auVar8._8_8_ = local_2a8._8_8_;
  auVar8._0_8_ = local_2a8._0_8_;
  auVar9._8_8_ = local_11c._44_8_;
  auVar9._0_8_ = local_11c._36_8_;
  local_368.colorThreshold.m_data = (float  [4])divps(auVar8,auVar9);
  local_368.coordBits.m_data[0] = 0x14;
  local_368.coordBits.m_data[1] = 0x14;
  local_368.coordBits.m_data[2] = 0x14;
  local_368.uvwBits.m_data[0] = 7;
  local_368.uvwBits.m_data[1] = 7;
  local_368.uvwBits.m_data[2] = 0;
  auVar21._0_4_ = -(uint)(0 < pixelFormat.redBits);
  auVar21._4_4_ = -(uint)(0 < pixelFormat.greenBits);
  auVar21._8_4_ = -(uint)(0 < pixelFormat.blueBits);
  auVar21._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
  uVar18 = movmskps(extraout_EAX,auVar21);
  bVar17 = (byte)uVar18;
  local_368.colorMask.m_data =
       (bool  [4])
       (uVar18 & 1 | (uint)((bVar17 & 2) >> 1) << 8 | (uint)((bVar17 & 4) >> 2) << 0x10 |
       (uint)(bVar17 >> 3) << 0x18);
  pTVar7 = ((this->super_TestInstance).m_context)->m_testCtx;
  local_388.m_numLevels = 8;
  local_388._4_4_ = 3;
  data = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    data = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_2a8,(TextureFormat *)&local_388,rendered.m_width,
             rendered.m_height,1,data);
  iVar15 = (*(pTVar10->super_TestTexture)._vptr_TestTexture[0x10])(pTVar10);
  local_388.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar15) + 0x50);
  local_388.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar15) + 0x48);
  bVar11 = glu::TextureTestUtil::verifyTextureResult
                     (pTVar7,(ConstPixelBufferAccess *)local_2a8,&local_388,(float *)&local_2e8,
                      (ReferenceParams *)local_11c,&local_368,&local_374,&pixelFormat);
  if (bVar11) {
LAB_007e1a78:
    iVar15 = this->m_caseNdx + 1;
    this->m_caseNdx = iVar15;
    iVar12 = (int)((ulong)((long)(this->m_cases).
                                 super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_cases).
                                super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2);
    if (SBORROW4(iVar15,iVar12 * -0x49249249) != iVar15 + iVar12 * 0x49249249 < 0) {
      tcu::TestStatus::incomplete();
      goto LAB_007e1bd5;
    }
    local_2a8._0_8_ = (long)local_2a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_2a8._0_8_,
               local_2a8._8_8_ + local_2a8._0_8_);
  }
  else {
    local_374.lodBits = 4;
    local_368.uvwBits.m_data[0] = 4;
    local_368.uvwBits.m_data[1] = 4;
    local_368.uvwBits.m_data[2] = 0;
    poVar1 = (ostringstream *)(local_2a8 + 8);
    local_2a8._0_8_ = TVar6;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Warning: Verification against high precision requirements failed, trying with lower requirements."
               ,0x61);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_230);
    pTVar7 = ((this->super_TestInstance).m_context)->m_testCtx;
    local_388.m_numLevels = 8;
    local_388._4_4_ = 3;
    if (rendered.m_pixels.m_cap != 0) {
      rendered.m_pixels.m_cap = (size_t)rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2a8,(TextureFormat *)&local_388,rendered.m_width,
               rendered.m_height,1,(void *)rendered.m_pixels.m_cap);
    iVar15 = (*(pTVar10->super_TestTexture)._vptr_TestTexture[0x10])(pTVar10);
    local_388.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_01,iVar15) + 0x50);
    local_388.m_numLevels = *(int *)(CONCAT44(extraout_var_01,iVar15) + 0x48);
    bVar11 = glu::TextureTestUtil::verifyTextureResult
                       (pTVar7,(ConstPixelBufferAccess *)local_2a8,&local_388,(float *)&local_2e8,
                        (ReferenceParams *)local_11c,&local_368,&local_374,&pixelFormat);
    if (bVar11) goto LAB_007e1a78;
    poVar1 = (ostringstream *)(local_2a8 + 8);
    local_2a8._0_8_ = TVar6;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "ERROR: Verification against low precision requirements failed, failing test case.",
               0x51);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_230);
    local_2a8._0_8_ = (long)local_2a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a8,"Image verification failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_2a8._0_8_,
               local_2a8._8_8_ + local_2a8._0_8_);
  }
  if (local_2a8._0_8_ != (long)local_2a8 + 0x10) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
  }
LAB_007e1bd5:
  tcu::Surface::~Surface(&rendered);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus Texture2DArrayFilteringTestInstance::iterate (void)
{
	tcu::TestLog&						log			= m_context.getTestContext().getLog();

	const FilterCase&					curCase		= m_cases[m_caseNdx];
	const pipeline::TestTexture2DArray&	texture		= m_renderer.get2DArrayTexture(curCase.textureIndex);
	const tcu::TextureFormat			texFmt		= texture.getTextureFormat();
	const tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams						refParams	(TEXTURETYPE_2D_ARRAY);
	tcu::Surface						rendered	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	tcu::Vec3							texCoord[4];
	const float* const					texCoordPtr	= (const float*)&texCoord[0];

	// Params for reference computation.

	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	log << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float	sX		= deFloatExp2(lodX) * float(m_renderer.getRenderWidth()) / float(m_textures[0]->getTexture().getWidth());
		const float	sY		= deFloatExp2(lodY) * float(m_renderer.getRenderHeight()) / float(m_textures[0]->getTexture().getHeight());
		const float	l0		= curCase.layerRange.x();
		const float	l1		= curCase.layerRange.y();

		texCoord[0] = tcu::Vec3(oX,		oY,		l0);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	l0*0.5f + l1*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		l0*0.5f + l1*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	l1);
	}

	m_renderer.renderQuad(rendered, curCase.textureIndex, texCoordPtr, refParams);

	{

		const bool				isNearestOnly	= m_testParameters.minFilter == Sampler::NEAREST && m_testParameters.magFilter == Sampler::NEAREST;
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_VULKAN);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::Texture2DArrayView)texture.getTexture(),
													   texCoordPtr, refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

			log << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::Texture2DArrayView)texture.getTexture(),
												  texCoordPtr, refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				return tcu::TestStatus::fail("Image verification failed");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}